

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::Misbehaving
          (PeerManagerImpl *this,Peer *peer,string *message)

{
  long lVar1;
  bool bVar2;
  Level level;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  allocator<char> local_49;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock36;
  string message_prefixed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock36,
             (AnnotatedMixin<std::mutex> *)
             &(this->m_rng).super_RandomMixin<FastRandomContext>.bitbuf_size,
             "peer.m_misbehavior_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x797,false);
  if (peer->m_our_services == NODE_NONE) {
    level = 0xc7f1cc;
    std::__cxx11::string::string<std::allocator<char>>((string *)&message_prefixed,"",&local_49);
  }
  else {
    level = 0xb60dce;
    std::operator+(&message_prefixed,": ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peer);
  }
  *(undefined1 *)((this->m_rng).rng.m_aligned.input + 8) = 1;
  bVar2 = ::LogAcceptCategory(NET,level);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "Misbehaving";
    logging_function._M_len = 0xb;
    LogPrintf_<long,std::__cxx11::string>
              (logging_function,source_file,0x79b,NET,Debug,"Misbehaving: peer=%d%s\n",(long *)this,
               &message_prefixed);
  }
  std::__cxx11::string::~string((string *)&message_prefixed);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock36.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::Misbehaving(Peer& peer, const std::string& message)
{
    LOCK(peer.m_misbehavior_mutex);

    const std::string message_prefixed = message.empty() ? "" : (": " + message);
    peer.m_should_discourage = true;
    LogDebug(BCLog::NET, "Misbehaving: peer=%d%s\n", peer.m_id, message_prefixed);
}